

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackTraceTest.cpp
# Opt level: O2

void __thiscall
StackTraceTest_moveAssignment_Test::TestBody(StackTraceTest_moveAssignment_Test *this)

{
  StackTrace __p;
  char *in_R9;
  AssertHelper local_60;
  StackTrace other;
  AssertHelper local_50;
  StackTrace frames;
  string local_40;
  AssertionResult gtest_ar_;
  
  cppassert::internal::StackTrace::getStackTrace();
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  gtest_ar_.success_ =
       *(long *)((long)frames.impl_._M_t.
                       super___uniq_ptr_impl<cppassert::internal::StackTraceImpl,_std::default_delete<cppassert::internal::StackTraceImpl>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cppassert::internal::StackTraceImpl_*,_std::default_delete<cppassert::internal::StackTraceImpl>_>
                       .super__Head_base<0UL,_cppassert::internal::StackTraceImpl_*,_false>.
                       _M_head_impl + 0x2808) != 2;
  if (!gtest_ar_.success_) {
    testing::Message::Message((Message *)&other);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_40,(internal *)&gtest_ar_,(AssertionResult *)"frames.size()>0","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/DariuszOstolski[P]cppassert/tests/StackTraceTest.cpp"
               ,0x12,local_40._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&other);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    std::__cxx11::string::~string((string *)&local_40);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&other);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  cppassert::internal::StackTrace::getStackTrace();
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  gtest_ar_.success_ =
       *(long *)((long)other.impl_._M_t.
                       super___uniq_ptr_impl<cppassert::internal::StackTraceImpl,_std::default_delete<cppassert::internal::StackTraceImpl>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cppassert::internal::StackTraceImpl_*,_std::default_delete<cppassert::internal::StackTraceImpl>_>
                       .super__Head_base<0UL,_cppassert::internal::StackTraceImpl_*,_false>.
                       _M_head_impl + 0x2808) != 2;
  if (!gtest_ar_.success_) {
    testing::Message::Message((Message *)&local_60);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_40,(internal *)&gtest_ar_,(AssertionResult *)"other.size()>0","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/DariuszOstolski[P]cppassert/tests/StackTraceTest.cpp"
               ,0x14,local_40._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    std::__cxx11::string::~string((string *)&local_40);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_60);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  __p = frames;
  frames.impl_._M_t.
  super___uniq_ptr_impl<cppassert::internal::StackTraceImpl,_std::default_delete<cppassert::internal::StackTraceImpl>_>
  ._M_t.
  super__Tuple_impl<0UL,_cppassert::internal::StackTraceImpl_*,_std::default_delete<cppassert::internal::StackTraceImpl>_>
  .super__Head_base<0UL,_cppassert::internal::StackTraceImpl_*,_false>._M_head_impl =
       (unique_ptr<cppassert::internal::StackTraceImpl,_std::default_delete<cppassert::internal::StackTraceImpl>_>
        )(__uniq_ptr_data<cppassert::internal::StackTraceImpl,_std::default_delete<cppassert::internal::StackTraceImpl>,_true,_true>
          )0x0;
  std::
  __uniq_ptr_impl<cppassert::internal::StackTraceImpl,_std::default_delete<cppassert::internal::StackTraceImpl>_>
  ::reset((__uniq_ptr_impl<cppassert::internal::StackTraceImpl,_std::default_delete<cppassert::internal::StackTraceImpl>_>
           *)&other,
          (pointer)__p.impl_._M_t.
                   super___uniq_ptr_impl<cppassert::internal::StackTraceImpl,_std::default_delete<cppassert::internal::StackTraceImpl>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_cppassert::internal::StackTraceImpl_*,_std::default_delete<cppassert::internal::StackTraceImpl>_>
                   .super__Head_base<0UL,_cppassert::internal::StackTraceImpl_*,_false>._M_head_impl
         );
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  gtest_ar_.success_ =
       *(long *)((long)other.impl_._M_t.
                       super___uniq_ptr_impl<cppassert::internal::StackTraceImpl,_std::default_delete<cppassert::internal::StackTraceImpl>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cppassert::internal::StackTraceImpl_*,_std::default_delete<cppassert::internal::StackTraceImpl>_>
                       .super__Head_base<0UL,_cppassert::internal::StackTraceImpl_*,_false>.
                       _M_head_impl + 0x2808) != 2;
  if (!gtest_ar_.success_) {
    testing::Message::Message((Message *)&local_60);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_40,(internal *)&gtest_ar_,(AssertionResult *)"other.size()>0","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/DariuszOstolski[P]cppassert/tests/StackTraceTest.cpp"
               ,0x16,local_40._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    std::__cxx11::string::~string((string *)&local_40);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_60);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  std::
  unique_ptr<cppassert::internal::StackTraceImpl,_std::default_delete<cppassert::internal::StackTraceImpl>_>
  ::~unique_ptr(&other.impl_);
  std::
  unique_ptr<cppassert::internal::StackTraceImpl,_std::default_delete<cppassert::internal::StackTraceImpl>_>
  ::~unique_ptr(&frames.impl_);
  return;
}

Assistant:

TEST(StackTraceTest, moveAssignment)
{
    StackTrace frames = StackTrace::getStackTrace();
    EXPECT_TRUE(frames.size()>0);
    StackTrace other = StackTrace::getStackTrace();
    EXPECT_TRUE(other.size()>0);
    other = std::move(frames);
    EXPECT_TRUE(other.size()>0);
}